

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_fail_example.cpp
# Opt level: O1

void foo4(int *a)

{
  long *plVar1;
  runtime_error *this;
  
  *a = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo4 a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"foo4 state_saver::dismiss",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void foo4(int& a) {
  MAKE_SAVER_EXIT(state_saver, a); // Custom state saver on fail.

  a = 4;
  std::cout << "foo4 a = " << a << std::endl;

  state_saver.dismiss(); // Dismiss, state will not automatically restored.
  std::cout << "foo4 state_saver::dismiss" << std::endl;
  throw std::runtime_error{"error"};
  // Original state will not automatically restored, on error.
}